

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::UnknownFieldSetTest_WrongExtensionTypeTreatedAsUnknown_Test::
~UnknownFieldSetTest_WrongExtensionTypeTreatedAsUnknown_Test
          (UnknownFieldSetTest_WrongExtensionTypeTreatedAsUnknown_Test *this)

{
  UnknownFieldSetTest_WrongExtensionTypeTreatedAsUnknown_Test *this_local;
  
  ~UnknownFieldSetTest_WrongExtensionTypeTreatedAsUnknown_Test(this);
  operator_delete(this,0x398);
  return;
}

Assistant:

TEST_F(UnknownFieldSetTest, WrongExtensionTypeTreatedAsUnknown) {
  // Test that fields of the wrong wire type are treated like unknown fields
  // when parsing extensions.

  unittest::TestAllExtensions all_extensions_message;
  unittest::TestEmptyMessage empty_message;
  std::string bizarro_data = GetBizarroData();
  ASSERT_TRUE(all_extensions_message.ParseFromString(bizarro_data));
  ASSERT_TRUE(empty_message.ParseFromString(bizarro_data));

  // All fields should have been interpreted as unknown, so the debug strings
  // should be the same.
  EXPECT_EQ(empty_message.DebugString(), all_extensions_message.DebugString());
}